

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-arithm.cpp
# Opt level: O2

void test_abs<unsigned_long>(uint length)

{
  unsigned_long *__p;
  ulong uVar1;
  ulong uVar2;
  ulong *local_28;
  shared_ptr<unsigned_long> pv;
  
  __p = sse::common::malloc<unsigned_long>(length);
  std::__shared_ptr<unsigned_long,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<unsigned_long,void(*)(unsigned_long*),void>
            ((__shared_ptr<unsigned_long,(__gnu_cxx::_Lock_policy)2> *)&local_28,__p,
             sse::common::free<unsigned_long>);
  uVar1 = 0;
  uVar2 = (ulong)length;
  if ((int)length < 1) {
    uVar2 = uVar1;
  }
  for (; -uVar1 != uVar2; uVar1 = uVar1 - 1) {
    *local_28 = uVar1;
    local_28 = local_28 + 1;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pv);
  return;
}

Assistant:

void test_abs(unsigned length = 47)
{
    auto pv = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    T * v = pv.get();

    for (int i = 0; i < (int)length; ++i)
        v[i] = -i;

    simd::abs(v, v, length);

    for (int i = 0; i < (int)length; ++i)
    {
        if (v[i] < 0 && v[i] != std::numeric_limits<T>::min())
            FAIL();
    }
}